

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::FilterExpr::do_evaluate
          (Value *__return_storage_ptr__,FilterExpr *this,shared_ptr<minja::Context> *context)

{
  pointer psVar1;
  Expression *this_00;
  bool bVar2;
  long lVar3;
  runtime_error *this_01;
  pointer psVar4;
  ArgumentsValue args;
  Value target;
  Value local_80;
  
  Value::Value(__return_storage_ptr__);
  psVar4 = (this->parts).
           super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->parts).
           super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  while( true ) {
    if (psVar4 == psVar1) {
      return __return_storage_ptr__;
    }
    this_00 = (psVar4->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (this_00 == (Expression *)0x0) break;
    if (bVar2) {
      Expression::evaluate(&target,this_00,context);
      Value::operator=(__return_storage_ptr__,&target);
    }
    else {
      lVar3 = __dynamic_cast(this_00,&Expression::typeinfo,&CallExpr::typeinfo,0);
      if (lVar3 == 0) {
        Expression::evaluate(&target,this_00,context);
        args.kwargs.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        args.kwargs.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        args.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        args.kwargs.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        args.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        args.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<minja::Value,_std::allocator<minja::Value>_>::insert
                  (&args.args,(const_iterator)0x0,__return_storage_ptr__);
        Value::call(&local_80,&target,context,&args);
      }
      else {
        Expression::evaluate(&target,*(Expression **)(lVar3 + 0x20),context);
        ArgumentsExpression::evaluate(&args,(ArgumentsExpression *)(lVar3 + 0x30),context);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::insert
                  (&args.args,
                   (const_iterator)
                   args.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl
                   .super__Vector_impl_data._M_start,__return_storage_ptr__);
        Value::call(&local_80,&target,context,&args);
      }
      Value::operator=(__return_storage_ptr__,&local_80);
      Value::~Value(&local_80);
      ArgumentsValue::~ArgumentsValue(&args);
    }
    Value::~Value(&target);
    psVar4 = psVar4 + 1;
    bVar2 = false;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"FilterExpr.part is null");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        Value result;
        bool first = true;
        for (const auto& part : parts) {
          if (!part) throw std::runtime_error("FilterExpr.part is null");
          if (first) {
            first = false;
            result = part->evaluate(context);
          } else {
            if (auto ce = dynamic_cast<CallExpr*>(part.get())) {
              auto target = ce->object->evaluate(context);
              ArgumentsValue args = ce->args.evaluate(context);
              args.args.insert(args.args.begin(), result);
              result = target.call(context, args);
            } else {
              auto callable = part->evaluate(context);
              ArgumentsValue args;
              args.args.insert(args.args.begin(), result);
              result = callable.call(context, args);
            }
          }
        }
        return result;
    }